

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wordlist.c
# Opt level: O1

size_t wordlist_lookup_word(words *w,char *word)

{
  ulong uVar1;
  int iVar2;
  char **ppcVar3;
  ulong uVar4;
  char **ppcVar5;
  size_t sVar6;
  
  if (w->sorted == false) {
    uVar1 = w->len;
    if (uVar1 == 0) {
      ppcVar3 = (char **)0x0;
    }
    else {
      ppcVar5 = w->indices;
      uVar4 = 1;
      ppcVar3 = (char **)0x0;
      do {
        iVar2 = strcmp(word,*ppcVar5);
        if (iVar2 == 0) {
          ppcVar3 = ppcVar5;
        }
        if (uVar1 <= uVar4) break;
        uVar4 = uVar4 + 1;
        ppcVar5 = ppcVar5 + 1;
      } while (ppcVar3 == (char **)0x0);
    }
  }
  else {
    ppcVar3 = (char **)bsearch(word,w->indices,w->len,8,bstrcmp);
  }
  if (ppcVar3 == (char **)0x0) {
    sVar6 = 0;
  }
  else {
    sVar6 = ((long)ppcVar3 - (long)w->indices >> 3) + 1;
  }
  return sVar6;
}

Assistant:

size_t wordlist_lookup_word(const struct words *w, const char *word)
{
    const size_t size = sizeof(const char *);
    const char **found = NULL;

    if (w->sorted)
        found = (const char **)bsearch(word, w->indices, w->len, size, bstrcmp);
    else {
        size_t i;
        for (i = 0; i < w->len && !found; ++i)
            if (!strcmp(word, w->indices[i]))
                found = w->indices + i;
    }
    return found ? found - w->indices + 1u : 0u;
}